

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitpackingaligned.cpp
# Opt level: O0

uint32_t * FastPForLib::__fastunpack31_24(uint32_t *in,uint32_t *out)

{
  uint *puVar1;
  uint32_t *out_local;
  uint32_t *in_local;
  
  *out = *in % 0x80000000;
  puVar1 = out + 1;
  *puVar1 = *in >> 0x1f;
  *puVar1 = (in[1] & 0x3fffffff) << 1 | *puVar1;
  puVar1 = out + 2;
  *puVar1 = in[1] >> 0x1e;
  *puVar1 = (in[2] & 0x1fffffff) << 2 | *puVar1;
  puVar1 = out + 3;
  *puVar1 = in[2] >> 0x1d;
  *puVar1 = (in[3] & 0xfffffff) << 3 | *puVar1;
  puVar1 = out + 4;
  *puVar1 = in[3] >> 0x1c;
  *puVar1 = (in[4] & 0x7ffffff) << 4 | *puVar1;
  puVar1 = out + 5;
  *puVar1 = in[4] >> 0x1b;
  *puVar1 = (in[5] & 0x3ffffff) << 5 | *puVar1;
  puVar1 = out + 6;
  *puVar1 = in[5] >> 0x1a;
  *puVar1 = (in[6] & 0x1ffffff) << 6 | *puVar1;
  puVar1 = out + 7;
  *puVar1 = in[6] >> 0x19;
  *puVar1 = (in[7] & 0xffffff) << 7 | *puVar1;
  puVar1 = out + 8;
  *puVar1 = in[7] >> 0x18;
  *puVar1 = (in[8] & 0x7fffff) << 8 | *puVar1;
  puVar1 = out + 9;
  *puVar1 = in[8] >> 0x17;
  *puVar1 = (in[9] & 0x3fffff) << 9 | *puVar1;
  puVar1 = out + 10;
  *puVar1 = in[9] >> 0x16;
  *puVar1 = (in[10] & 0x1fffff) << 10 | *puVar1;
  puVar1 = out + 0xb;
  *puVar1 = in[10] >> 0x15;
  *puVar1 = (in[0xb] & 0xfffff) << 0xb | *puVar1;
  puVar1 = out + 0xc;
  *puVar1 = in[0xb] >> 0x14;
  *puVar1 = (in[0xc] & 0x7ffff) << 0xc | *puVar1;
  puVar1 = out + 0xd;
  *puVar1 = in[0xc] >> 0x13;
  *puVar1 = (in[0xd] & 0x3ffff) << 0xd | *puVar1;
  puVar1 = out + 0xe;
  *puVar1 = in[0xd] >> 0x12;
  *puVar1 = (in[0xe] & 0x1ffff) << 0xe | *puVar1;
  puVar1 = out + 0xf;
  *puVar1 = in[0xe] >> 0x11;
  *puVar1 = (in[0xf] & 0xffff) << 0xf | *puVar1;
  puVar1 = out + 0x10;
  *puVar1 = in[0xf] >> 0x10;
  *puVar1 = (in[0x10] & 0x7fff) << 0x10 | *puVar1;
  puVar1 = out + 0x11;
  *puVar1 = in[0x10] >> 0xf;
  *puVar1 = (in[0x11] & 0x3fff) << 0x11 | *puVar1;
  puVar1 = out + 0x12;
  *puVar1 = in[0x11] >> 0xe;
  *puVar1 = (in[0x12] & 0x1fff) << 0x12 | *puVar1;
  puVar1 = out + 0x13;
  *puVar1 = in[0x12] >> 0xd;
  *puVar1 = (in[0x13] & 0xfff) << 0x13 | *puVar1;
  puVar1 = out + 0x14;
  *puVar1 = in[0x13] >> 0xc;
  *puVar1 = (in[0x14] & 0x7ff) << 0x14 | *puVar1;
  puVar1 = out + 0x15;
  *puVar1 = in[0x14] >> 0xb;
  *puVar1 = (in[0x15] & 0x3ff) << 0x15 | *puVar1;
  puVar1 = out + 0x16;
  *puVar1 = in[0x15] >> 10;
  *puVar1 = (in[0x16] & 0x1ff) << 0x16 | *puVar1;
  puVar1 = out + 0x17;
  *puVar1 = in[0x16] >> 9;
  *puVar1 = (in[0x17] & 0xff) << 0x17 | *puVar1;
  return in + 0x18;
}

Assistant:

const uint32_t *__fastunpack31_24(const uint32_t *__restrict__ in,
                                  uint32_t *__restrict__ out) {

  *out = ((*in) >> 0) % (1U << 31);
  out++;
  *out = ((*in) >> 31);
  ++in;
  *out |= ((*in) % (1U << 30)) << (31 - 30);
  out++;
  *out = ((*in) >> 30);
  ++in;
  *out |= ((*in) % (1U << 29)) << (31 - 29);
  out++;
  *out = ((*in) >> 29);
  ++in;
  *out |= ((*in) % (1U << 28)) << (31 - 28);
  out++;
  *out = ((*in) >> 28);
  ++in;
  *out |= ((*in) % (1U << 27)) << (31 - 27);
  out++;
  *out = ((*in) >> 27);
  ++in;
  *out |= ((*in) % (1U << 26)) << (31 - 26);
  out++;
  *out = ((*in) >> 26);
  ++in;
  *out |= ((*in) % (1U << 25)) << (31 - 25);
  out++;
  *out = ((*in) >> 25);
  ++in;
  *out |= ((*in) % (1U << 24)) << (31 - 24);
  out++;
  *out = ((*in) >> 24);
  ++in;
  *out |= ((*in) % (1U << 23)) << (31 - 23);
  out++;
  *out = ((*in) >> 23);
  ++in;
  *out |= ((*in) % (1U << 22)) << (31 - 22);
  out++;
  *out = ((*in) >> 22);
  ++in;
  *out |= ((*in) % (1U << 21)) << (31 - 21);
  out++;
  *out = ((*in) >> 21);
  ++in;
  *out |= ((*in) % (1U << 20)) << (31 - 20);
  out++;
  *out = ((*in) >> 20);
  ++in;
  *out |= ((*in) % (1U << 19)) << (31 - 19);
  out++;
  *out = ((*in) >> 19);
  ++in;
  *out |= ((*in) % (1U << 18)) << (31 - 18);
  out++;
  *out = ((*in) >> 18);
  ++in;
  *out |= ((*in) % (1U << 17)) << (31 - 17);
  out++;
  *out = ((*in) >> 17);
  ++in;
  *out |= ((*in) % (1U << 16)) << (31 - 16);
  out++;
  *out = ((*in) >> 16);
  ++in;
  *out |= ((*in) % (1U << 15)) << (31 - 15);
  out++;
  *out = ((*in) >> 15);
  ++in;
  *out |= ((*in) % (1U << 14)) << (31 - 14);
  out++;
  *out = ((*in) >> 14);
  ++in;
  *out |= ((*in) % (1U << 13)) << (31 - 13);
  out++;
  *out = ((*in) >> 13);
  ++in;
  *out |= ((*in) % (1U << 12)) << (31 - 12);
  out++;
  *out = ((*in) >> 12);
  ++in;
  *out |= ((*in) % (1U << 11)) << (31 - 11);
  out++;
  *out = ((*in) >> 11);
  ++in;
  *out |= ((*in) % (1U << 10)) << (31 - 10);
  out++;
  *out = ((*in) >> 10);
  ++in;
  *out |= ((*in) % (1U << 9)) << (31 - 9);
  out++;
  *out = ((*in) >> 9);
  ++in;
  *out |= ((*in) % (1U << 8)) << (31 - 8);
  out++;

  return in + 1;
}